

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

PositionalBase * __thiscall args::Command::GetNextPositional(Command *this)

{
  pointer ppBVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PositionalBase *pPVar3;
  pointer ppBVar4;
  bool bVar5;
  
  if (this->selectedCommand == (Command *)0x0) {
    if (this->subparser != (Subparser *)0x0) {
      iVar2 = (*(this->subparser->super_Group).super_Base._vptr_Base[8])();
      return (PositionalBase *)CONCAT44(extraout_var_01,iVar2);
    }
    iVar2 = (*(this->super_Group).super_Base._vptr_Base[2])(this);
    if ((char)iVar2 != '\0') {
      ppBVar4 = (this->super_Group).children.
                super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppBVar1 = (this->super_Group).children.
                super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppBVar4 != ppBVar1) {
        do {
          iVar2 = (*(*ppBVar4)->_vptr_Base[8])();
          if ((PositionalBase *)CONCAT44(extraout_var_02,iVar2) != (PositionalBase *)0x0) {
            return (PositionalBase *)CONCAT44(extraout_var_02,iVar2);
          }
          ppBVar4 = ppBVar4 + 1;
        } while (ppBVar4 != ppBVar1);
        return (PositionalBase *)0x0;
      }
    }
  }
  else {
    iVar2 = (*(this->selectedCommand->super_Group).super_Base._vptr_Base[8])();
    if ((PositionalBase *)CONCAT44(extraout_var,iVar2) != (PositionalBase *)0x0) {
      return (PositionalBase *)CONCAT44(extraout_var,iVar2);
    }
    ppBVar1 = (this->super_Group).children.
              super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pPVar3 = (PositionalBase *)0x0;
    for (ppBVar4 = (this->super_Group).children.
                   super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppBVar4 != ppBVar1; ppBVar4 = ppBVar4 + 1) {
      bVar5 = true;
      if (((*ppBVar4)->options & Global) != None) {
        iVar2 = (*(*ppBVar4)->_vptr_Base[8])();
        bVar5 = (PositionalBase *)CONCAT44(extraout_var_00,iVar2) == (PositionalBase *)0x0;
        if (!bVar5) {
          pPVar3 = (PositionalBase *)CONCAT44(extraout_var_00,iVar2);
        }
      }
      if (!bVar5) {
        return pPVar3;
      }
    }
  }
  return (PositionalBase *)0x0;
}

Assistant:

virtual PositionalBase *GetNextPositional() override
            {
                if (selectedCommand != nullptr)
                {
                    if (auto *res = selectedCommand->GetNextPositional())
                    {
                        return res;
                    }

                    for (auto *child: Children())
                    {
                        if ((child->GetOptions() & Options::Global) != Options::None)
                        {
                            if (auto *res = child->GetNextPositional())
                            {
                                return res;
                            }
                        }
                    }

                    return nullptr;
                }

                if (subparser != nullptr)
                {
                    return subparser->GetNextPositional();
                }

                return Matched() ? Group::GetNextPositional() : nullptr;
            }